

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

string * __thiscall
vkt::SpirVAssembly::getNumberTypeName_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,NumberType type)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 == 2) {
    pcVar3 = "float";
    pcVar1 = "";
  }
  else if (iVar2 == 1) {
    pcVar3 = "uint";
    pcVar1 = "";
  }
  else if (iVar2 == 0) {
    pcVar3 = "int";
    pcVar1 = "";
  }
  else {
    pcVar1 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

const string getNumberTypeName (const NumberType type)
{
	if (type == TYPE_INT)
	{
		return "int";
	}
	else if (type == TYPE_UINT)
	{
		return "uint";
	}
	else if (type == TYPE_FLOAT)
	{
		return "float";
	}
	else
	{
		DE_ASSERT(false);
		return "";
	}
}